

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileStream.cc
# Opt level: O2

auto_ptr<avro::InputStream> __thiscall
avro::istreamInputStream(avro *this,istream *is,size_t bufferSize)

{
  BufferCopyInInputStream *this_00;
  auto_ptr<avro::(anonymous_namespace)::BufferCopyIn> in;
  
  in._M_ptr = (BufferCopyIn *)operator_new(0x10);
  (in._M_ptr)->_vptr_BufferCopyIn = (_func_int **)&PTR__BufferCopyIn_001a36e8;
  in._M_ptr[1]._vptr_BufferCopyIn = (_func_int **)is;
  this_00 = (BufferCopyInInputStream *)operator_new(0x38);
  BufferCopyInInputStream::BufferCopyInInputStream(this_00,&in,bufferSize);
  *(BufferCopyInInputStream **)this = this_00;
  if (in._M_ptr != (BufferCopyIn *)0x0) {
    (*(in._M_ptr)->_vptr_BufferCopyIn[1])();
  }
  return (auto_ptr<avro::InputStream>)(InputStream *)this;
}

Assistant:

auto_ptr<InputStream> istreamInputStream(istream& is,
    size_t bufferSize)
{
    auto_ptr<BufferCopyIn> in(new IStreamBufferCopyIn(is));
    return auto_ptr<InputStream>( new BufferCopyInInputStream(in, bufferSize));
}